

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O2

int __thiscall
crnlib::sparse_bit_array::find_first_set_bit(sparse_bit_array *this,uint index,uint num)

{
  uint32 **ppuVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint v;
  uint uVar8;
  long lVar9;
  int iVar10;
  
  if (num == 0) {
    return -1;
  }
  uVar6 = (ulong)index;
  ppuVar1 = this->m_ppGroups;
  while( true ) {
    uVar5 = (uint)uVar6;
    if (0x200 < num && (uVar6 & 0x1ff) == 0) {
      uVar7 = num & 0x1ff;
      uVar8 = (num & 0xfffffe00) + uVar5;
      iVar3 = -uVar5;
      for (; 0x1ff < num; num = num - 0x200) {
        lVar2 = *(long *)((long)ppuVar1 + (uVar6 >> 6));
        if (lVar2 != 0) {
          iVar10 = iVar3;
          for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
            uVar4 = *(uint *)(lVar2 + lVar9 * 4);
            if (uVar4 != 0) {
              uVar4 = math::count_trailing_zero_bits(uVar4);
              return uVar4 - iVar10;
            }
            iVar10 = iVar10 + -0x20;
          }
        }
        uVar6 = (ulong)((int)uVar6 + 0x200);
        iVar3 = iVar3 + -0x200;
      }
      while( true ) {
        if (uVar7 == 0) {
          return -1;
        }
        uVar5 = 0x20;
        if (uVar7 < 0x20) {
          uVar5 = uVar7;
        }
        if ((ppuVar1[uVar8 >> 9] != (uint32 *)0x0) &&
           (v = (0xffffffffU >> (-(char)uVar5 & 0x1fU)) << ((byte)uVar8 & 0x1f) &
                *(uint *)((long)ppuVar1[uVar8 >> 9] + (ulong)(uVar8 >> 3 & 0x3c)), v != 0)) break;
        uVar7 = uVar7 - uVar5;
        uVar8 = uVar8 + uVar5;
      }
      uVar4 = math::count_trailing_zero_bits(v);
      return (uVar8 & 0xffffffe0) + uVar4;
    }
    uVar8 = 0x20 - (uVar5 & 0x1f);
    if (num <= uVar8) {
      uVar8 = num;
    }
    if ((ppuVar1[uVar6 >> 9] != (uint32 *)0x0) &&
       (uVar7 = (0xffffffffU >> (-(char)uVar8 & 0x1fU)) << (sbyte)(uVar5 & 0x1f) &
                ppuVar1[uVar6 >> 9][(uVar5 & 0x1ff) >> 5], uVar7 != 0)) break;
    uVar6 = (ulong)(uVar5 + uVar8);
    num = num - uVar8;
    if (num == 0) {
      return -1;
    }
  }
  uVar4 = math::count_trailing_zero_bits(uVar7);
  return (uVar5 & 0xffffffe0) + uVar4;
}

Assistant:

int sparse_bit_array::find_first_set_bit(uint index, uint num) const
    {
        CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

        if (!num)
        {
            return -1;
        }

        while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup))
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            const uint group_bit_ofs = index & cBitsPerGroupMask;
            const uint dword_bit_ofs = group_bit_ofs & 31;

            const uint max_bits_to_examine = 32 - dword_bit_ofs;
            const uint bits_to_examine = math::minimum(max_bits_to_examine, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_examine));

                uint bits = pGroup[group_bit_ofs >> 5] & (msk << dword_bit_ofs);
                if (bits)
                {
                    uint num_trailing_zeros = math::count_trailing_zero_bits(bits);
                    int set_index = num_trailing_zeros + (index & ~31);
                    CRNLIB_ASSERT(get_bit(set_index));
                    return set_index;
                }
            }

            num -= bits_to_examine;
            if (!num)
            {
                return -1;
            }

            index += bits_to_examine;
        }

        while (num >= cBitsPerGroup)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                for (uint i = 0; i < cDWORDsPerGroup; i++)
                {
                    uint32 bits = pGroup[i];
                    if (bits)
                    {
                        uint num_trailing_zeros = math::count_trailing_zero_bits(bits);

                        int set_index = num_trailing_zeros + index + (i << 5);
                        CRNLIB_ASSERT(get_bit(set_index));
                        return set_index;
                    }
                }
            }

            num -= cBitsPerGroup;
            index += cBitsPerGroup;
        }

        while (num)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint bits_to_examine = math::minimum(32U, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                uint group_bit_ofs = index & cBitsPerGroupMask;

                uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_examine));

                uint32 bits = pGroup[group_bit_ofs >> 5] & (msk << (group_bit_ofs & 31));
                if (bits)
                {
                    uint num_trailing_zeros = math::count_trailing_zero_bits(bits);

                    int set_index = num_trailing_zeros + (index & ~31);
                    CRNLIB_ASSERT(get_bit(set_index));
                    return set_index;
                }
            }

            num -= bits_to_examine;
            index += bits_to_examine;
        }

        return -1;
    }